

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SaturationAlgorithm.cpp
# Opt level: O0

void __thiscall Saturation::SaturationAlgorithm::onNewClause(SaturationAlgorithm *this,Clause *cl)

{
  bool bVar1;
  ostream *poVar2;
  Splitter *in_RSI;
  long in_RDI;
  Clause *in_stack_00000788;
  Options *in_stack_ffffffffffffffa0;
  Clause *in_stack_ffffffffffffffb0;
  string local_30 [24];
  Clause *in_stack_ffffffffffffffe8;
  
  if (*(long *)(in_RDI + 0xd0) != 0) {
    Splitter::onNewClause(in_RSI,in_stack_ffffffffffffffe8);
  }
  bVar1 = Shell::Options::showNew(in_stack_ffffffffffffffa0);
  if (bVar1) {
    poVar2 = std::operator<<((ostream *)&std::cout,"[SA] new: ");
    Kernel::Clause::toString_abi_cxx11_(in_stack_00000788);
    in_stack_ffffffffffffffb0 = (Clause *)std::operator<<(poVar2,local_30);
    std::ostream::operator<<(in_stack_ffffffffffffffb0,std::endl<char,std::char_traits<char>>);
    std::__cxx11::string::~string(local_30);
  }
  bVar1 = Kernel::Clause::isPropositional(in_stack_ffffffffffffffb0);
  if (bVar1) {
    onNewUsefulPropositionalClause((SaturationAlgorithm *)in_RSI,in_stack_ffffffffffffffe8);
  }
  if (*(long *)(in_RDI + 0xf0) != 0) {
    (**(code **)(**(long **)(in_RDI + 0xf0) + 0x18))(*(long **)(in_RDI + 0xf0),in_RSI);
  }
  return;
}

Assistant:

void SaturationAlgorithm::onNewClause(Clause* cl)
{
#if VDEBUG && VZ3
  if (cl->isPureTheoryDescendant()){
    bool couldNotCheck = false;
    ASS_REP(TheoryInstAndSimp::isTheoryLemma(cl,couldNotCheck),cl->toString())
  }
#endif

  if (_splitter) {
    _splitter->onNewClause(cl);
  }

  if (env.options->showNew()) {
    std::cout << "[SA] new: " << cl->toString() << std::endl;
  }

  if (cl->isPropositional()) {
    onNewUsefulPropositionalClause(cl);
  }

  if (_answerLiteralManager) {
    _answerLiteralManager->onNewClause(cl);
  }
}